

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer_factory.cc
# Opt level: O1

unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>
draco::FileWriterFactory::OpenWriter(string *file_name)

{
  pointer pp_Var1;
  pointer pcVar2;
  vector<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *pvVar3;
  pointer *__ptr;
  pointer pp_Var4;
  bool bVar5;
  
  pvVar3 = (anonymous_namespace)::GetFileWriterOpenFunctions_abi_cxx11_();
  pp_Var4 = (pvVar3->
            super__Vector_base<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pp_Var1 = (pvVar3->
            super__Vector_base<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = pp_Var4 == pp_Var1;
  if (!bVar5) {
    (**pp_Var4)(file_name);
    pcVar2 = (file_name->_M_dataplus)._M_p;
    while (pcVar2 == (pointer)0x0) {
      pp_Var4 = pp_Var4 + 1;
      (file_name->_M_dataplus)._M_p = (pointer)0x0;
      bVar5 = pp_Var4 == pp_Var1;
      if (bVar5) goto LAB_0011249a;
      (**pp_Var4)(file_name);
      pcVar2 = (file_name->_M_dataplus)._M_p;
    }
    if (!bVar5) {
      return (__uniq_ptr_data<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>,_true,_true>
              )(__uniq_ptr_data<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>,_true,_true>
                )file_name;
    }
  }
LAB_0011249a:
  OpenWriter((FileWriterFactory *)file_name);
  return (__uniq_ptr_data<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>,_true,_true>
          )(__uniq_ptr_data<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>,_true,_true>
            )file_name;
}

Assistant:

std::unique_ptr<FileWriterInterface> FileWriterFactory::OpenWriter(
    const std::string &file_name) {
  for (auto open_function : *GetFileWriterOpenFunctions()) {
    auto writer = open_function(file_name);
    if (writer == nullptr) {
      continue;
    }
    return writer;
  }
  FILEWRITER_LOG_ERROR("No file writer able to open output");
  return nullptr;
}